

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O3

InsertResult __thiscall
wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>::insert
          (OrderedFixedStorage<wasm::GCData_*,_2UL> *this,GCData **x)

{
  ulong uVar1;
  GCData *pGVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (this->super_FixedStorageBase<wasm::GCData_*,_2UL>).used;
  if (uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    do {
      pGVar2 = (this->super_FixedStorageBase<wasm::GCData_*,_2UL>).storage._M_elems[uVar3];
      if (*x <= pGVar2) {
        uVar4 = uVar3;
        if (pGVar2 == *x) {
          return NoError;
        }
        break;
      }
      uVar3 = uVar3 + 1;
      uVar4 = uVar1;
    } while (uVar1 != uVar3);
    if (2 < uVar1) {
      __assert_fail("this->used <= N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_set.h"
                    ,99,
                    "InsertResult wasm::OrderedFixedStorage<wasm::GCData *, 2>::insert(const T &) [T = wasm::GCData *, N = 2]"
                   );
    }
    if (uVar1 == 2) {
      return CouldNotInsert;
    }
  }
  if (uVar4 != uVar1) {
    for (uVar3 = uVar1; uVar4 + 1 <= uVar3; uVar3 = uVar3 - 1) {
      (this->super_FixedStorageBase<wasm::GCData_*,_2UL>).storage._M_elems[uVar3] =
           (this->super_FixedStorageBase<wasm::GCData_*,_2UL>).storage._M_elems[uVar3 - 1];
    }
  }
  (this->super_FixedStorageBase<wasm::GCData_*,_2UL>).storage._M_elems[uVar4] = *x;
  (this->super_FixedStorageBase<wasm::GCData_*,_2UL>).used = uVar1 + 1;
  return NoError;
}

Assistant:

InsertResult insert(const T& x) {
    // Find the insertion point |i| where x should be placed.
    size_t i = 0;
    while (i < this->used && this->storage[i] < x) {
      i++;
    }
    if (i < this->used && this->storage[i] == x) {
      // The item already exists.
      return InsertResult::NoError;
    }
    // |i| is now the location where x should be placed.

    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }

    if (i != this->used) {
      // Push things forward to make room for x.
      for (size_t j = this->used; j >= i + 1; j--) {
        this->storage[j] = this->storage[j - 1];
      }
    }

    this->storage[i] = x;
    this->used++;
    return InsertResult::NoError;
  }